

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

bool __thiscall Corrade::Utility::Configuration::save(Configuration *this,string *filename)

{
  ssize_t sVar1;
  Debug *debug;
  StringView SVar2;
  ArrayView<const_char> AVar3;
  ostringstream out;
  Error local_1d0;
  StringView local_1a8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  save(this,(ostream *)local_198);
  SVar2 = Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::from(filename);
  std::__cxx11::stringbuf::str();
  local_1a8 = Containers::Implementation::
              StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::from((string *)&local_1d0);
  AVar3 = Containers::Implementation::
          ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>::from
                    (&local_1a8);
  sVar1 = Path::write((Path *)SVar2._data,(int)SVar2._sizePlusFlags,AVar3._data,AVar3._size);
  if (local_1d0.super_Debug._output != (ostream *)&local_1d0.super_Debug._sourceLocationFile) {
    operator_delete(local_1d0.super_Debug._output);
  }
  if ((char)sVar1 == '\0') {
    Error::Error(&local_1d0,(Flags)0x0);
    debug = Debug::operator<<(&local_1d0.super_Debug,
                              "Utility::Configuration::save(): cannot open file");
    Implementation::debugPrintStlString(debug,filename);
    Error::~Error(&local_1d0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return (bool)(char)sVar1;
}

Assistant:

bool Configuration::save(const std::string& filename) {
    /* Save to a stringstream and then write it as a string to the file. Doing
       it this way to avoid issues with Unicode filenames on Windows. */
    /** @todo get rid of streams altogether, and then of the StringView cast
        also */
    std::ostringstream out;
    save(out);
    if(Path::write(filename, Containers::StringView{out.str()}))
        return true;

    Error() << "Utility::Configuration::save(): cannot open file" << filename;
    return false;
}